

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O1

int max_mon_load(monst *mtmp)

{
  ushort uVar1;
  permonst *ppVar2;
  int iVar3;
  ulong uVar4;
  
  ppVar2 = mtmp->data;
  uVar1 = ppVar2->cwt;
  if ((ulong)uVar1 == 0) {
    uVar4 = (ulong)ppVar2->msize * 500;
  }
  else if ((0x5aa < uVar1) || (uVar4 = 1000, (ppVar2->mflags2 & 0x4000000) == 0)) {
    uVar4 = ((ulong)uVar1 * 1000) / 0x5aa;
  }
  uVar4 = uVar4 >> ((ppVar2->mflags2 & 0x4000000) == 0);
  iVar3 = 1;
  if (1 < (long)uVar4) {
    iVar3 = (int)uVar4;
  }
  return iVar3;
}

Assistant:

int max_mon_load(struct monst *mtmp)
{
	long maxload;

	/* Base monster carrying capacity is equal to human maximum
	 * carrying capacity, or half human maximum if not strong.
	 * (for a polymorphed player, the value used would be the
	 * non-polymorphed carrying capacity instead of max/half max).
	 * This is then modified by the ratio between the monster weights
	 * and human weights.  Corpseless monsters are given a capacity
	 * proportional to their size instead of weight.
	 */
	if (!mtmp->data->cwt)
		maxload = (MAX_CARR_CAP * (long)mtmp->data->msize) / MZ_HUMAN;
	else if (!strongmonst(mtmp->data)
		|| (strongmonst(mtmp->data) && (mtmp->data->cwt > WT_HUMAN)))
		maxload = (MAX_CARR_CAP * (long)mtmp->data->cwt) / WT_HUMAN;
	else	maxload = MAX_CARR_CAP; /*strong monsters w/cwt <= WT_HUMAN*/

	if (!strongmonst(mtmp->data)) maxload /= 2;

	if (maxload < 1) maxload = 1;

	return (int) maxload;
}